

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O3

void __thiscall
gmath::RadialTangentialDistortion::transform
          (RadialTangentialDistortion *this,double *x,double *y,double xd,double yd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = xd * xd + yd * yd;
  dVar3 = this->kd[4] * dVar4 * dVar4 * dVar4 +
          this->kd[3] * dVar4 * dVar4 + this->kd[2] * dVar4 + 1.0;
  dVar1 = this->kd[0];
  dVar2 = this->kd[1];
  *x = ((xd + xd) * xd + dVar4) * dVar2 + xd * dVar3 + (dVar1 + dVar1) * xd * yd;
  *y = (dVar2 + dVar2) * xd * yd + dVar3 * yd + ((yd + yd) * yd + dVar4) * dVar1;
  return;
}

Assistant:

void RadialTangentialDistortion::transform(double &x, double &y, double xd, double yd) const
{
  const double r2=xd*xd+yd*yd;
  const double s=1.0 + kd[2]*r2 + kd[3]*r2*r2 + kd[4]*r2*r2*r2;

  const double xx=xd*s + 2*kd[0]*xd*yd        +   kd[1]*(r2+2*xd*xd);
  const double yy=yd*s +   kd[0]*(r2+2*yd*yd) + 2*kd[1]*xd*yd;

  x=xx;
  y=yy;
}